

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void int_init(void)

{
  int_timer_init();
  int_io_init();
  int_file_init();
  int_panic_init();
  int_unblock();
  return;
}

Assistant:

void int_init(void) {
  int_timer_init(); /* periodic interrupt timer */
  int_io_init();    /* SIGIO async I/O handlers */
  int_file_init();  /* file-io TIMEOUT support */
  int_panic_init(); /* catch for all other dangerous interrupts */

#ifdef FLTINT
  int_fp_init(); /* Floating-point exception handler */
#endif

  int_unblock(); /* Turn on interrupts */
}